

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 11_struct_as_param.cpp
# Opt level: O1

travel_time combine_travel_time(travel_time tt1,travel_time tt2)

{
  travel_time tVar1;
  int iVar2;
  
  iVar2 = tt2.mins + tt1.mins;
  tVar1.hours = iVar2 / 0x3c + tt2.hours + tt1.hours;
  tVar1.mins = iVar2 % 0x3c;
  return tVar1;
}

Assistant:

travel_time combine_travel_time(travel_time tt1, travel_time tt2) {
    travel_time total;
    total.mins = (tt1.mins + tt2.mins) % MIN_PER_HOUR;
    //  不用手动取整
    total.hours = (tt1.hours + tt2.hours) + (tt1.mins + tt2.mins) / MIN_PER_HOUR;
    //  尝试修改一下一个入参
    tt1.hours = 100;
    tt2.hours = 100;
    //  并不会改变实际入参的值
    return total;
}